

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O1

Element __thiscall ftxui::anon_unknown_3::ButtonBase::Render(ButtonBase *this)

{
  char cVar1;
  Components *pCVar2;
  bool bVar3;
  Components *pCVar4;
  ComponentBase *pCVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  ComponentBase *in_RSI;
  code *pcVar7;
  Element EVar8;
  Element EStack_e8;
  Element local_d8;
  Element local_c8;
  _Any_data local_b8;
  code *local_a8;
  string local_98;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  bVar3 = ComponentBase::Focused(in_RSI);
  if (bVar3) {
    pcVar7 = inverted;
  }
  else {
    pcVar7 = nothing;
  }
  pCVar2 = (Components *)
           in_RSI[3].children_.
           super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pCVar4 = &in_RSI[3].children_;
  if (pCVar2 != (Components *)0x0) {
    pCVar4 = pCVar2;
  }
  cVar1 = *(char *)&(pCVar4->
                    super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
  pCVar5 = in_RSI + 1;
  if (in_RSI[1].parent_ != (ComponentBase *)0x0) {
    pCVar5 = in_RSI[1].parent_;
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pCVar5->_vptr_ComponentBase,
             (long)&(((pCVar5->children_).
                      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
             (long)pCVar5->_vptr_ComponentBase);
  text((ftxui *)&EStack_e8,&local_98);
  if (cVar1 == '\0') {
    local_58._M_unused._M_object = nothing;
  }
  else {
    local_58._M_unused._M_object = border;
  }
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_manager;
  operator|((ftxui *)&local_d8,&EStack_e8,(Decorator *)&local_58);
  local_78._8_8_ = 0;
  pcStack_60 = std::
               _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_manager;
  local_78._M_unused._M_function_pointer = pcVar7;
  operator|((ftxui *)&local_c8,&local_d8,(Decorator *)&local_78);
  reflect((Box *)&in_RSI[2].parent_);
  EVar8 = operator|((ftxui *)this,&local_c8,(Decorator *)&local_b8);
  _Var6 = EVar8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
    _Var6._M_pi = extraout_RDX;
  }
  if (local_c8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var6._M_pi = extraout_RDX_00;
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
    _Var6._M_pi = extraout_RDX_01;
  }
  if (local_d8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var6._M_pi = extraout_RDX_02;
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
    _Var6._M_pi = extraout_RDX_03;
  }
  if (EStack_e8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (EStack_e8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var6._M_pi = extraout_RDX_04;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    _Var6._M_pi = extraout_RDX_05;
  }
  EVar8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi;
  EVar8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() override {
    auto style = Focused() ? inverted : nothing;
    auto my_border = option_->border ? border : nothing;
    return text(*label_) | my_border | style | reflect(box_);
  }